

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

void stat_cb(uv_fs_t *req)

{
  if (req == &stat_req) {
    if ((stat_req.fs_type & ~UV_FS_OPEN) != UV_FS_STAT) goto LAB_00151499;
    if (stat_req.result != 0) goto LAB_0015149e;
    if (stat_req.ptr == (void *)0x0) goto LAB_001514a3;
    stat_cb_count = stat_cb_count + 1;
    req = &stat_req;
    uv_fs_req_cleanup(&stat_req);
    if (stat_req.ptr == (void *)0x0) {
      return;
    }
  }
  else {
    stat_cb_cold_1();
LAB_00151499:
    stat_cb_cold_2();
LAB_0015149e:
    stat_cb_cold_3();
LAB_001514a3:
    stat_cb_cold_5();
  }
  stat_cb_cold_4();
  if (req == &unlink_req) {
    if (unlink_req.fs_type != UV_FS_UNLINK) goto LAB_001514e5;
    if (unlink_req.result == 0) {
      unlink_cb_count = unlink_cb_count + 1;
      uv_fs_req_cleanup(&unlink_req);
      return;
    }
  }
  else {
    unlink_cb_cold_1();
LAB_001514e5:
    unlink_cb_cold_2();
  }
  unlink_cb_cold_3();
  if (req == &rmdir_req) {
    if (rmdir_req.fs_type != UV_FS_RMDIR) goto LAB_00151549;
    if (rmdir_req.result != 0) goto LAB_0015154e;
    rmdir_cb_count = rmdir_cb_count + 1;
    if (rmdir_req.path != (char *)0x0) {
      if (rmdir_req.path[8] == '\0' && *(long *)rmdir_req.path == 0x7269645f74736574) {
        uv_fs_req_cleanup(&rmdir_req);
        return;
      }
      goto LAB_00151558;
    }
  }
  else {
    rmdir_cb_cold_1();
LAB_00151549:
    rmdir_cb_cold_2();
LAB_0015154e:
    rmdir_cb_cold_3();
  }
  rmdir_cb_cold_5();
LAB_00151558:
  rmdir_cb_cold_4();
  test_sendfile(sendfile_setup,sendfile_cb,0x1000a);
  return;
}

Assistant:

static void stat_cb(uv_fs_t* req) {
  ASSERT(req == &stat_req);
  ASSERT(req->fs_type == UV_FS_STAT || req->fs_type == UV_FS_LSTAT);
  ASSERT(req->result == 0);
  ASSERT(req->ptr);
  stat_cb_count++;
  uv_fs_req_cleanup(req);
  ASSERT(!req->ptr);
}